

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O3

bool __thiscall GoState<3U,_3U>::has_moves(GoState<3U,_3U> *this)

{
  void *local_28;
  void *local_20;
  
  (*this->_vptr_GoState[0xc])(&local_28,this);
  if (local_28 != (void *)0x0) {
    operator_delete(local_28);
  }
  return local_28 != local_20;
}

Assistant:

virtual bool has_moves() const
	{
		// TODO: make faster.
		return ! get_moves().empty();
	}